

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.c
# Opt level: O1

void SmokeStep(Gamefield *gamefield,IntVec2 coords)

{
  uint uVar1;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  IntVec2 local_38;
  IntVec2 local_30;
  
  uVar6 = coords.x;
  local_30.y = coords.y;
  iVar2 = local_30.y;
  uVar1 = local_30.y + 1;
  local_30 = coords;
  if (-1 < (int)(uVar1 | uVar6)) {
    if (((uVar6 < gamefield->width) && (uVar1 < gamefield->height)) &&
       (local_38.x = uVar6, local_38.y = uVar1, _Var3 = CheckDensity(gamefield,&local_30,&local_38),
       _Var3)) {
      return;
    }
    if (((-1 < (int)(uVar1 | uVar6)) && (uVar6 < gamefield->width)) &&
       ((uVar1 < gamefield->height &&
        (local_38.x = uVar6, local_38.y = uVar1,
        gamefield->pixels[gamefield->width * uVar1 + uVar6].pixelType == Empty))))
    goto LAB_001404d0;
  }
  uVar4 = uVar6 - 1;
  if (-1 < (int)(uVar1 | uVar4)) {
    if ((uVar4 < gamefield->width) && (uVar1 < gamefield->height)) {
      iVar5 = gamefield->width * uVar1;
      if ((gamefield->pixels[iVar5 + uVar4].pixelType == Empty) &&
         (((local_38.x = uVar6 + 1,
           (uint)local_38.x < gamefield->width && -1 < (int)(uVar1 | local_38.x) &&
           (uVar1 < gamefield->height)) &&
          (gamefield->pixels[(uint)(iVar5 + local_38.x)].pixelType == Empty)))) {
        local_38.y = uVar1;
        if ((gamefield->simulationStep & 1) == 0) {
          local_38.x = uVar4;
        }
        goto LAB_001404d0;
      }
    }
    if (((-1 < (int)(uVar1 | uVar4)) && (uVar4 < gamefield->width)) &&
       ((uVar1 < gamefield->height &&
        (local_38.x = uVar4, local_38.y = uVar1,
        gamefield->pixels[gamefield->width * uVar1 + uVar4].pixelType == Empty))))
    goto LAB_001404d0;
  }
  local_38.x = uVar6 + 1;
  if ((((int)(uVar1 | local_38.x) < 0) || (gamefield->width <= (uint)local_38.x)) ||
     ((gamefield->height <= uVar1 ||
      (local_38.y = uVar1,
      gamefield->pixels[gamefield->width * uVar1 + local_38.x].pixelType != Empty)))) {
    if (-1 < (int)(iVar2 | uVar4)) {
      if ((uVar4 < gamefield->width) && ((uint)iVar2 < gamefield->height)) {
        iVar5 = gamefield->width * iVar2;
        if ((gamefield->pixels[iVar5 + uVar4].pixelType == Empty) &&
           ((((uint)local_38.x < gamefield->width && -1 < (iVar2 | local_38.x) &&
             ((uint)iVar2 < gamefield->height)) &&
            (gamefield->pixels[(uint)(iVar5 + local_38.x)].pixelType == Empty)))) {
          local_38.y = iVar2;
          if ((gamefield->simulationStep & 1) == 0) {
            local_38.x = uVar4;
          }
          goto LAB_001404d0;
        }
      }
      if (((-1 < (int)(iVar2 | uVar4)) && (uVar4 < gamefield->width)) &&
         (((uint)iVar2 < gamefield->height &&
          (gamefield->pixels[gamefield->width * iVar2 + uVar4].pixelType == Empty)))) {
        local_38.y = iVar2;
        local_38.x = uVar4;
        goto LAB_001404d0;
      }
    }
    if ((iVar2 | local_38.x) < 0) {
      return;
    }
    if (gamefield->width <= (uint)local_38.x) {
      return;
    }
    if (gamefield->height <= (uint)iVar2) {
      return;
    }
    if (gamefield->pixels[gamefield->width * iVar2 + local_38.x].pixelType != Empty) {
      return;
    }
    local_38.y = iVar2;
  }
LAB_001404d0:
  SwapSmokePixel(gamefield,&local_30,&local_38);
  return;
}

Assistant:

void SmokeStep(Gamefield* gamefield, IntVec2 coords) {
    struct IntVec2 new;
    new.x = coords.x;
    new.y = coords.y + 1;

    if (WithinBounds(gamefield, coords.x, coords.y + 1) && CheckDensity(gamefield, &coords, &new)) {
        return;
    }

    if (WithinBounds(gamefield, coords.x, coords.y + 1) && gamefield->pixels[(coords.y + 1) * gamefield->width + coords.x].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y += 1;
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y + 1) &&
               gamefield->pixels[(coords.y + 1) * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y + 1) &&
               gamefield->pixels[(coords.y + 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.y += 1;
            new.x -= 1;
        } else {
            new.y += 1;
            new.x += 1;
        }
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y + 1) &&
               gamefield->pixels[(coords.y + 1) * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y += 1;
        new.x -= 1;
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y + 1) &&
               gamefield->pixels[(coords.y + 1) * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.y += 1;
        new.x += 1;
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty
               && WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        if (gamefield->simulationStep % 2 == 0) {
            new.x -= 1;
        } else {
            new.x += 1;
        }
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x - 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x - 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x -= 1;
        SwapSmokePixel(gamefield, &coords, &new);
    } else if (WithinBounds(gamefield, coords.x + 1, coords.y)
               && gamefield->pixels[coords.y * gamefield->width + (coords.x + 1)].pixelType == Empty) {
        new.x = coords.x;
        new.y = coords.y;
        new.x += 1;
        SwapSmokePixel(gamefield, &coords, &new);
    }
}